

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

bool __thiscall rw::Geometry::streamWrite(Geometry *this,Stream *stream)

{
  Triangle *pTVar1;
  MorphTarget *pMVar2;
  void *pvVar3;
  uint32 uVar4;
  int32 i_1;
  long lVar5;
  int32 i;
  long lVar6;
  uint32 tribuf [2];
  uint local_40;
  undefined8 local_3c;
  int32 local_34;
  
  uVar4 = streamGetSize(this);
  writeChunkHeader(stream,0xf,uVar4);
  uVar4 = geoStructSize(this);
  writeChunkHeader(stream,1,uVar4);
  local_40 = this->numTexCoordSets << 0x10 | this->flags;
  local_3c._0_4_ = this->numTriangles;
  local_3c._4_4_ = this->numVertices;
  local_34 = this->numMorphTargets;
  Stream::write32(stream,&local_40,0x10);
  if (version < 0x34000) {
    Stream::write32(stream,streamWrite::fbuf,0xc);
  }
  if ((this->flags >> 0x18 & 1) == 0) {
    if ((this->flags & 8) != 0) {
      (*stream->_vptr_Stream[3])(stream,this->colors,(ulong)(uint)(this->numVertices << 2));
    }
    for (lVar6 = 0; lVar6 < this->numTexCoordSets; lVar6 = lVar6 + 1) {
      Stream::write32(stream,this->texCoords[lVar6],this->numVertices << 3);
    }
    for (lVar6 = 0; lVar6 < this->numTriangles; lVar6 = lVar6 + 1) {
      pTVar1 = this->triangles;
      tribuf[0] = CONCAT22(pTVar1[lVar6].v[0],pTVar1[lVar6].v[1]);
      tribuf[1] = CONCAT22(pTVar1[lVar6].v[2],pTVar1[lVar6].matId);
      Stream::write32(stream,tribuf,8);
    }
  }
  lVar6 = 0x20;
  for (lVar5 = 0; lVar5 < this->numMorphTargets; lVar5 = lVar5 + 1) {
    pMVar2 = this->morphTargets;
    Stream::write32(stream,(void *)((long)pMVar2 + lVar6 + -0x18),0x10);
    if ((this->flags & 0x1000000) == 0) {
      Stream::writeI32(stream,(uint)(*(long *)((long)pMVar2 + lVar6 + -8) != 0));
      Stream::writeI32(stream,(uint)(*(long *)((long)&pMVar2->parent + lVar6) != 0));
      pvVar3 = *(void **)((long)pMVar2 + lVar6 + -8);
      if (pvVar3 != (void *)0x0) {
        Stream::write32(stream,pvVar3,this->numVertices * 0xc);
      }
      pvVar3 = *(void **)((long)&pMVar2->parent + lVar6);
      if (pvVar3 != (void *)0x0) {
        Stream::write32(stream,pvVar3,this->numVertices * 0xc);
      }
    }
    else {
      Stream::writeI32(stream,0);
      Stream::writeI32(stream,0);
    }
    lVar6 = lVar6 + 0x28;
  }
  MaterialList::streamWrite(&this->matList,stream);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Geometry::streamWrite(Stream *stream)
{
	GeoStreamData buf;
	static float32 fbuf[3] = { 1.0f, 1.0f, 1.0f };

	writeChunkHeader(stream, ID_GEOMETRY, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, geoStructSize(this));

	buf.flags = this->flags | this->numTexCoordSets << 16;
	buf.numTriangles = this->numTriangles;
	buf.numVertices = this->numVertices;
	buf.numMorphTargets = this->numMorphTargets;
	stream->write32(&buf, sizeof(buf));
	if(version < 0x34000)
		stream->write32(fbuf, sizeof(fbuf));

	if(!(this->flags & NATIVE)){
		if(this->flags & PRELIT)
			stream->write8(this->colors, 4*this->numVertices);
		for(int32 i = 0; i < this->numTexCoordSets; i++)
			stream->write32(this->texCoords[i],
				    2*this->numVertices*4);
		for(int32 i = 0; i < this->numTriangles; i++){
			uint32 tribuf[2];
			tribuf[0] = this->triangles[i].v[0] << 16 |
			            this->triangles[i].v[1];
			tribuf[1] = this->triangles[i].v[2] << 16 |
			            this->triangles[i].matId;
			stream->write32(tribuf, 8);
		}
	}

	for(int32 i = 0; i < this->numMorphTargets; i++){
		MorphTarget *m = &this->morphTargets[i];
		stream->write32(&m->boundingSphere, 4*4);
		if(!(this->flags & NATIVE)){
			stream->writeI32(m->vertices != nil);
			stream->writeI32(m->normals != nil);
			if(m->vertices)
				stream->write32(m->vertices,
				             3*this->numVertices*4);
			if(m->normals)
				stream->write32(m->normals,
				             3*this->numVertices*4);
		}else{
			stream->writeI32(0);
			stream->writeI32(0);
		}
	}

	this->matList.streamWrite(stream);

	s_plglist.streamWrite(stream, this);
	return true;
}